

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

int level_range(xchar dgn,int base,int rrand,int chain,proto_dungeon *pd,int *adjusted_base)

{
  uint uVar1;
  int iVar2;
  undefined7 in_register_00000039;
  
  uVar1 = (uint)dungeons[(int)CONCAT71(in_register_00000039,dgn)].num_dunlevs;
  if (chain < 0) {
    if (base < 0) {
      base = base + uVar1 + 1;
    }
  }
  else {
    if (pd->final_lev[(uint)chain] == (s_level *)0x0) {
      panic("level_range: empty chain level!");
    }
    base = base + (pd->final_lev[(uint)chain]->dlevel).dlevel;
  }
  if (base <= (int)uVar1 && 0 < base) {
    *adjusted_base = base;
    if (rrand == 0) {
      iVar2 = 1;
    }
    else if (rrand == -1) {
      iVar2 = (uVar1 - base) + 1;
    }
    else {
      iVar2 = (uVar1 - base) + 1;
      if (rrand + base + -1 <= (int)uVar1) {
        iVar2 = rrand;
      }
    }
    return iVar2;
  }
  panic("level_range: base value out of range. base: %d, lmax: %d",(ulong)(uint)base,(ulong)uVar1);
}

Assistant:

static int level_range(xchar dgn, int base, int rrand, int chain,
		       struct proto_dungeon *pd, int *adjusted_base)
{
	int lmax = dungeons[dgn].num_dunlevs;

	if (chain >= 0) {		 /* relative to a special level */
	    s_level *levtmp = pd->final_lev[chain];
	    if (!levtmp) panic("level_range: empty chain level!");

	    base += levtmp->dlevel.dlevel;
	} else {			/* absolute in the dungeon */
	    /* from end of dungeon */
	    if (base < 0) base = (lmax + base + 1);
	}

	if (base < 1 || base > lmax)
	    panic("level_range: base value out of range. base: %d, lmax: %d", base, lmax);

	*adjusted_base = base;

	if (rrand == -1) {	/* from base to end of dungeon */
	    return lmax - base + 1;
	} else if (rrand) {
	    /* make sure we don't run off the end of the dungeon */
	    return ((base + rrand - 1) > lmax) ? lmax-base+1 : rrand;
	} /* else only one choice */
	return 1;
}